

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_MeshComponentRef * __thiscall
ON_MeshTopology::MeshComponentRef
          (ON_MeshComponentRef *__return_storage_ptr__,ON_MeshTopology *this,ON_COMPONENT_INDEX ci)

{
  ON_MeshComponentRef OStack_38;
  
  ON_MeshComponentRef::ON_MeshComponentRef(__return_storage_ptr__);
  if (this->m_mesh != (ON_Mesh *)0x0) {
    ON_Mesh::MeshComponentRef(&OStack_38,this->m_mesh,ci);
    ON_MeshComponentRef::operator=(__return_storage_ptr__,&OStack_38);
    ON_MeshComponentRef::~ON_MeshComponentRef(&OStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_MeshComponentRef ON_MeshTopology::MeshComponentRef(ON_COMPONENT_INDEX ci) const
{
  ON_MeshComponentRef cr;
  if ( 0 != m_mesh )
    cr = m_mesh->MeshComponentRef(ci);
  return cr;
}